

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O3

int fits_make_longstr_key_util
              (fitsfile *fptr,char *keyname,char *value,char *comm,int position,int *status)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  char *pcVar15;
  int iVar16;
  int tstatus;
  char valstring [81];
  char comstring [81];
  char card [81];
  char tstring [81];
  int local_244;
  size_t local_240;
  int local_238;
  int local_21c;
  ulong local_218;
  char *local_210;
  fitsfile *local_208;
  undefined8 local_200;
  char local_1f8 [95];
  char acStack_199 [2];
  undefined7 uStack_197;
  char local_190;
  undefined1 local_14e;
  char local_148 [96];
  char local_e8 [8];
  undefined2 local_e0;
  char local_88 [88];
  
  local_21c = -1;
  if (0 < *status) {
    return *status;
  }
  local_208 = fptr;
  local_240 = strlen(value);
  local_210 = comm;
  local_200 = value;
  if (comm == (char *)0x0) {
    sVar10 = 0;
  }
  else {
    sVar10 = strlen(comm);
  }
  pcVar15 = keyname + -1;
  do {
    pcVar1 = pcVar15 + 1;
    pcVar15 = pcVar15 + 1;
  } while (*pcVar1 == ' ');
  strncpy(acStack_199 + 1,pcVar15,0x4a);
  local_14e = 0;
  sVar11 = strlen(acStack_199 + 1);
  if ((int)sVar11 == 0) {
    iVar8 = fftkey(pcVar15,&local_21c);
    local_218 = 0xb;
    if (iVar8 < 1) {
LAB_001b8344:
      local_238 = 0x44;
      local_218 = 10;
      goto LAB_001b837f;
    }
  }
  else {
    cVar2 = acStack_199[(int)sVar11];
    pcVar15 = acStack_199 + (int)sVar11;
    while (cVar2 == ' ') {
      *pcVar15 = '\0';
      cVar2 = pcVar15[-1];
      pcVar15 = pcVar15 + -1;
    }
    sVar11 = strlen(acStack_199 + 1);
    iVar8 = (int)sVar11;
    if (iVar8 < 9) {
      iVar9 = fftkey(pcVar15,&local_21c);
      if (iVar9 < 1) goto LAB_001b8344;
      if (iVar8 == 0) {
        local_218 = 0xb;
        goto LAB_001b836e;
      }
    }
    if (acStack_199[1] == 'h') {
      lVar12 = 0x6863726172656968;
LAB_001b82f1:
      if (local_190 == ' ' && lVar12 == CONCAT71(uStack_197,acStack_199[1])) {
        local_218 = (ulong)(iVar8 + 2);
        goto LAB_001b836e;
      }
    }
    else if (acStack_199[1] == 'H') {
      lVar12 = 0x4843524152454948;
      goto LAB_001b82f1;
    }
    if (0x45 < iVar8) {
      ffpmsg("The following keyword is too long to fit on a card in ffpkls:");
      ffpmsg(keyname);
      *status = 0xcf;
      return 0xcf;
    }
    local_218 = (ulong)(iVar8 + 0xb);
  }
LAB_001b836e:
  local_238 = 0x4e - (int)local_218;
LAB_001b837f:
  bVar6 = true;
  bVar5 = false;
  bVar3 = false;
  local_244 = 0;
  do {
    iVar8 = (int)sVar10;
    if (bVar3) {
      if (iVar8 < 0x30) {
        local_1f8[0] = '\'';
        local_1f8[1] = '\'';
        local_1f8[2] = 0x20;
      }
      else {
        local_1f8[0] = '\'';
        local_1f8[1] = '&';
        local_1f8[2] = 0x27;
      }
      builtin_strncpy(local_1f8 + 3,"                 ",0x12);
      iVar9 = 0x2f;
      if (iVar8 < 0x2f) {
        iVar9 = iVar8;
      }
      strncpy(local_148,local_210 + local_244,(long)iVar9);
      local_148[iVar9] = '\0';
      local_244 = local_244 + iVar9;
      sVar10 = (size_t)(uint)(iVar8 - iVar9);
      bVar3 = true;
      bVar4 = true;
    }
    else {
      pcVar15 = local_200 + local_244;
      sVar11 = strlen(pcVar15);
      iVar9 = 0;
      if ((int)(uint)sVar11 < 1) {
        uVar14 = 0;
      }
      else {
        uVar14 = 0;
        if (0 < local_238) {
          iVar9 = 0;
          uVar7 = 1;
          do {
            uVar14 = uVar7;
            iVar9 = (uint)(pcVar15[uVar14 - 1] == '\'') + iVar9;
            if (((uint)sVar11 & 0x7fffffff) <= uVar14) break;
            uVar7 = uVar14 + 1;
          } while ((int)uVar14 + iVar9 < local_238);
        }
      }
      iVar16 = local_238 - iVar9;
      if ((int)uVar14 < local_238 - iVar9) {
        iVar16 = (int)uVar14;
      }
      local_88[0] = '\0';
      strncat(local_88,pcVar15,(long)iVar16);
      if (bVar6) {
        ffs2c(local_88,local_1f8,status);
        sVar11 = strlen(local_1f8);
        iVar9 = (int)sVar11;
        iVar13 = 0x50 - ((int)local_218 + iVar9);
        if ((((int)local_240 != iVar16) || (0x2e < iVar8)) ||
           (0x4d < (int)local_218 + iVar8 + iVar9)) goto LAB_001b8555;
      }
      else {
        ffs2c_nopad(local_88,local_1f8,status);
        sVar11 = strlen(local_1f8);
        iVar9 = (int)sVar11;
        iVar13 = 0x46 - iVar9;
LAB_001b8555:
        if (!bVar5) {
          if (iVar13 == 0) {
            if ((iVar8 != 0) || (iVar16 < (int)local_240)) {
              iVar16 = iVar16 + -1;
              lVar12 = (long)iVar9;
              if (local_1f8[lVar12 + -2] == '\'') {
                local_1f8[lVar12 + -3] = '&';
                local_1f8[lVar12 + -1] = '\0';
              }
              else {
                *(undefined1 *)((long)&local_200 + lVar12 + 6) = 0x26;
              }
            }
          }
          else if ((iVar16 < (int)local_240) ||
                  ((iVar8 != 0 && (((iVar13 < 0x32 || (0x2f < iVar8)) || (iVar13 + -3 < iVar8))))))
          {
            pcVar15 = local_1f8 + (long)iVar9 + -1;
            pcVar15[0] = '&';
            pcVar15[1] = '\'';
            local_1f8[(long)iVar9 + 1] = '\0';
          }
          if ((int)local_240 - iVar16 == 0 || (int)local_240 < iVar16) {
            bVar3 = true;
            if (iVar8 == 0) {
              sVar10 = 0;
            }
            else {
              local_240 = 0;
              if (0x31 < iVar13) {
                local_244 = 0x2f;
                if (iVar8 < 0x2f) {
                  local_244 = iVar8;
                }
                strncpy(local_148,local_210,(long)local_244);
                local_148[local_244] = '\0';
                sVar10 = (size_t)(uint)(iVar8 - local_244);
                bVar4 = true;
                goto LAB_001b8696;
              }
            }
            local_240 = 0;
            local_244 = 0;
            bVar4 = false;
          }
          else {
            local_244 = local_244 + iVar16;
            bVar4 = false;
            local_238 = 0x44;
            bVar3 = false;
            local_240 = (ulong)(uint)((int)local_240 - iVar16);
          }
LAB_001b8696:
          bVar5 = false;
          goto LAB_001b869d;
        }
      }
      if (local_210 == (char *)0x0) {
        local_148[0] = '\0';
      }
      else {
        strcpy(local_148,local_210);
      }
      bVar5 = true;
      bVar4 = true;
      local_240 = 0;
      sVar10 = 0;
      bVar3 = false;
    }
LAB_001b869d:
    if (bVar6) {
      if (bVar4) {
        pcVar15 = local_148;
      }
      else {
        pcVar15 = (char *)0x0;
      }
      ffmkky(keyname,local_1f8,pcVar15,local_e8,status);
    }
    else {
      if (bVar4) {
        pcVar15 = local_148;
      }
      else {
        pcVar15 = (char *)0x0;
      }
      ffmkky("CONTINUE",local_1f8,pcVar15,local_e8,status);
      local_e0 = 0x2020;
    }
    if (position < 0) {
      ffprec(local_208,local_e8,status);
    }
    else {
      ffirec(local_208,position,local_e8,status);
      position = position + 1;
    }
    bVar6 = false;
    if (((int)local_240 < 1) && ((int)sVar10 < 1)) {
      return *status;
    }
  } while( true );
}

Assistant:

int fits_make_longstr_key_util( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *keyname,/* I - name of keyword to write */
            const char *value,  /* I - keyword value            */
            const char *comm,   /* I - keyword comment          */
            int position,       /* I - position to insert (-1 for end) */
            int  *status)       /* IO - error status            */
/*
  Write (put) the keyword, value and comment into the FITS header.
  This routine is a modified version of ffpkys which supports the
  HEASARC long string convention and can write arbitrarily long string
  keyword values.  The value is continued over multiple keywords that
  have the name CONTINUE without an equal sign in column 9 of the card.
  This routine also supports simple string keywords which are less than
  75 characters in length.
*/
{
    char valstring[FLEN_CARD], comstring[FLEN_CARD];
    /* give tmpkeyname same size restriction as in ffmkky */
    char card[FLEN_CARD], tmpkeyname[FLEN_KEYWORD];
    char tstring[FLEN_CARD], *cptr;
    int next, remainval, remaincom, vlen, nquote, nchar; 
    int namelen, finalnamelen, maxvalchars;
    int contin, tstatus=-1, nocomment=0, ichar, addline=1;
    int spaceForComments=0, processingComment=0, nblanks=0, allInOne=0;
    /* This setting is arbitrary */
    int fixedSpaceForComments = 50;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    remainval = strlen(value);   
    if (comm)
       remaincom = strlen(comm);
    else
       remaincom = 0;

    tmpkeyname[0] = '\0';    
    cptr = keyname;
    while(*cptr == ' ')   /* skip over leading spaces in name */
        cptr++;
        
    strncpy(tmpkeyname, cptr, FLEN_KEYWORD-1);
    tmpkeyname[FLEN_KEYWORD-1] = '\0';
    
    namelen = strlen(tmpkeyname);
    if (namelen)         /* skip trailing spaces in name */
    {
       cptr = tmpkeyname + namelen - 1;
       while (*cptr == ' ')
       {
          *cptr = '\0';
          cptr--;
       }
       namelen = strlen(tmpkeyname);
    }
    
    /* First determine final length of keyword.  ffmkky may prepend 
       "HIERARCH " to it, and we need to determine that now using the
       same criteria as ffmkky. */
    
    if (namelen <= 8 && (fftkey(cptr, &tstatus) <= 0) )
    {
       /* This a normal 8-character FITS keyword. ffmkky
          will pad it to 8 if necessary, and add "= ". */
       finalnamelen = 10;
       /* 2 additional chars are needed for opening/closing quotes. */
       maxvalchars = (FLEN_CARD-1) - finalnamelen  - 2;
    }
    else
    { 
       if (namelen && ((FSTRNCMP(tmpkeyname, "HIERARCH ", 9) == 0) ||
                   (FSTRNCMP(tmpkeyname, "hierarch ", 9) == 0)) )
       {
          /* We have an explicitly marked long keyword, so HIERARCH
             will not be prepended.  However it can then have
             " = " or "= ", depending on size of value string. 
             For now, assume "= ". 
             
             If we're here, must have 75 > namelen > 9. */
          finalnamelen = namelen + 2;
       }
       else
       {
          /* ffmkky is going to prepend "HIERARCH " to the keyword,
             and " = " or "= ". */
          finalnamelen = namelen + 11;
          if (finalnamelen > FLEN_CARD-1)
          {
             ffpmsg("The following keyword is too long to fit on a card in ffpkls:");
             ffpmsg(keyname);
             return(*status = BAD_KEYCHAR);
          }
       }
       maxvalchars = (FLEN_CARD-1) - finalnamelen - 2;       
    }
    
    contin = 0;
    next = 0;                  /* pointer to next character to write */

    while (addline)
    {
        if (processingComment)
        {
           if (remaincom > (fixedSpaceForComments-3))
           {
              strcpy(valstring,"'&'");
              nblanks = (FLEN_CARD-1) - fixedSpaceForComments - 13;
              memset(&valstring[3], 32, nblanks);
              valstring[nblanks+3] = '\0';
           }
           else
           {
              strcpy(valstring,"''");
              nblanks = (FLEN_CARD-1) - fixedSpaceForComments - 12;
              memset(&valstring[2], 32, nblanks);
              valstring[nblanks+2] = '\0';
           }
           nchar = minvalue(remaincom, fixedSpaceForComments-3);
           strncpy(comstring, &comm[next], nchar);
           comstring[nchar] = '\0';
           next += nchar;
           remaincom -= nchar;
        }
        else
        {
           vlen = strlen(&value[next]);
           nquote = 0;
           for (ichar=0; ichar<vlen && (ichar+nquote)<maxvalchars; ++ichar)
           {
              if (value[next+ichar] == '\'')
                 ++nquote;
           }
           /* Note that (ichar+nquote) can be 1 greater than maxvalchars
              if last processed char is a quote.  Therefore do this check: */
           nchar = minvalue(ichar,(maxvalchars-nquote));
    
           tstring[0] = '\0';
           strncat(tstring, &value[next], nchar); /* copy string to temp buff */
           /* expand quotes, and put quotes around the string */
           if (contin)
           {
              ffs2c_nopad(tstring,valstring,status);
              vlen = strlen(valstring);
              spaceForComments = (FLEN_CARD-1) - (10 + vlen);
           }
           else
           {
              ffs2c(tstring, valstring, status);
              vlen = strlen(valstring);
              spaceForComments = (FLEN_CARD-1) - (finalnamelen + vlen);
           }
           
           /* Check for simplest case where everything fits on first line.*/
           if (!contin && (remainval==nchar) && 
                      (finalnamelen+vlen+remaincom+3 < FLEN_CARD) &&
                      remaincom < fixedSpaceForComments-3)
              allInOne=1;
           
           if (!allInOne)
           {   
              /* There are 2 situations which require overwriting the last char of
                 valstring with a continue symbol '&' */
              if (!spaceForComments && (remaincom || (remainval > nchar)))

              {
                  nchar -= 1;        /* outputting one less character now */

                  if (valstring[vlen-2] != '\'')
                      valstring[vlen-2] = '&';  /*  overwrite last char with &  */
                  else
                  { /* last char was a pair of single quotes, so over write both */
                      valstring[vlen-3] = '&';
                      valstring[vlen-1] = '\0';
                  }
              }
              else if ( 
               /* Cases where '&' should be appended to valstring rather than
                   overwritten.  This would mostly be due to the inclusion
                   of a comment string requiring additional lines.  But there's
                   also the obscure case where the last character that can
                   fit happened to be a single quote.  Since this was removed
                   with the earlier 'nchar = minvlaue()' test, the valstring
                   must be continued even though it's one space short of filling
                   this line.  We then append it with a '&'. */


              (spaceForComments && nchar < remainval) || 
              (remaincom && (spaceForComments < fixedSpaceForComments ||
                        spaceForComments-3 < remaincom ||
                        remaincom > fixedSpaceForComments-3))) 
              {
                valstring[vlen-1] = '&';
                 valstring[vlen] = '\'';
                 valstring[vlen+1] = '\0';
                 vlen+=1;
              }
           }
           
           if (allInOne)
           {
              nocomment=0;
              /* The allInOne test ensures that comm length will
                 fit within FLEN_CARD buffer size */
              if (comm)
                 strcpy(comstring, comm);
              else
                 comstring[0]='\0';
              /* Ensure that loop exits after this iteration */
              remainval=0;
              remaincom=0;
           }
           else if (remainval > nchar)
           {
              nocomment = 1;
              remainval -= nchar;
              next  += nchar;
              maxvalchars = (FLEN_CARD-1) - 12;
           }
           else
           {
              /* We've reached the end of val input.  Now switch to writing
                 comment (if any).  This block can only be reached once. */
              /* Do not write comments on this line if fewer than
                 fixedSpaceForComments are available for the comment string 
                 and " / ". */
              nocomment = 1;
              remainval = 0;
              next = 0;
              processingComment = 1;
              if (remaincom && spaceForComments >= fixedSpaceForComments)
              {
                 nocomment = 0;
                 nchar = minvalue(remaincom, fixedSpaceForComments-3);
                 strncpy(comstring, comm, nchar);
                 comstring[nchar] = '\0';
                 next = nchar;
                 remaincom -= nchar;
              }
           }

        } /* end if processing valstring and not comment */

        if (contin)           /* This is a CONTINUEd keyword */
        {
           if (nocomment) {
               ffmkky("CONTINUE", valstring, NULL, card, status); /* make keyword w/o comment */
           } else {
               ffmkky("CONTINUE", valstring, comstring, card, status); /* make keyword */
	   }
           strncpy(&card[8], "   ",  2);  /* overwrite the '=' */
        }
        else
        {
           if (nocomment)
              ffmkky(keyname, valstring, NULL, card, status);  /* make keyword */
           else
              ffmkky(keyname, valstring, comstring, card, status);  /* make keyword */
        }

        if (position < 0)
           ffprec(fptr, card, status);  /* write the keyword */
        else
        {
           ffirec(fptr, position, card, status);  /* insert the keyword */
           ++position;
        }
           
        contin = 1;
        nocomment = 0;
        addline = (int)(remainval > 0 || remaincom > 0);
    }
    return(*status);
}